

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

long GetStreamWriteAvailable(PaStream *s)

{
  PaHostApiTypeId hostApiType;
  int iVar1;
  snd_pcm_sframes_t sVar2;
  pthread_t __thread1;
  long errorCode;
  PaAlsaStream *in_RDI;
  int __pa_unsure_error_id;
  snd_pcm_sframes_t savail;
  int xrun;
  unsigned_long avail;
  PaAlsaStream *stream;
  PaError result;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  unsigned_long *in_stack_ffffffffffffffd8;
  int local_14;
  
  paUtilErr_ = PaAlsaStreamComponent_GetAvailableFrames
                         ((PaAlsaStreamComponent *)in_RDI,in_stack_ffffffffffffffd8,
                          (int *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (paUtilErr_ < 0) {
    PaUtil_DebugPrint(
                     "Expression \'PaAlsaStreamComponent_GetAvailableFrames( &stream->playback, &avail, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4534\n"
                     );
    local_14 = paUtilErr_;
  }
  else {
    if (in_stack_ffffffffffffffd4 == 0) {
      return (long)in_stack_ffffffffffffffd8;
    }
    paUtilErr_ = PaAlsaStream_HandleXrun(in_RDI);
    if (paUtilErr_ < 0) {
      PaUtil_DebugPrint(
                       "Expression \'PaAlsaStream_HandleXrun( stream )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4539\n"
                       );
      local_14 = paUtilErr_;
    }
    else {
      sVar2 = (*alsa_snd_pcm_avail_update)((in_RDI->playback).pcm);
      hostApiType = (PaHostApiTypeId)sVar2;
      if (-1 < (int)hostApiType) {
        return sVar2;
      }
      __thread1 = pthread_self();
      iVar1 = pthread_equal(__thread1,paUnixMainThread);
      if (iVar1 != 0) {
        errorCode = (long)(int)hostApiType;
        (*alsa_snd_strerror)(hostApiType);
        PaUtil_SetLastHostErrorInfo(hostApiType,errorCode,(char *)0x115a76);
      }
      PaUtil_DebugPrint(
                       "Expression \'savail\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4543\n"
                       );
      local_14 = -9999;
    }
  }
  return (long)local_14;
}

Assistant:

static signed long GetStreamWriteAvailable( PaStream* s )
{
    PaError result = paNoError;
    PaAlsaStream *stream = (PaAlsaStream*)s;
    unsigned long avail;
    int xrun;

    PA_ENSURE( PaAlsaStreamComponent_GetAvailableFrames( &stream->playback, &avail, &xrun ) );
    if( xrun )
    {
        snd_pcm_sframes_t savail;

        PA_ENSURE( PaAlsaStream_HandleXrun( stream ) );
        savail = alsa_snd_pcm_avail_update( stream->playback.pcm );

        /* savail should not contain -EPIPE now, since PaAlsaStream_HandleXrun will only prepare the pcm */
        ENSURE_( savail, paUnanticipatedHostError );

        avail = (unsigned long) savail;
    }

    return (signed long)avail;

error:
    return result;
}